

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  pointer this;
  element_type *this_00;
  reference pbVar2;
  ostream *this_01;
  string local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  iterator __end1;
  iterator __begin1;
  element_type *__range1;
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  resultingStatus;
  __single_object spSTM;
  undefined1 local_30 [8];
  shared_ptr<Status> spExecStatus;
  shared_ptr<Data> spData;
  
  std::make_shared<Data>();
  std::make_shared<Status>();
  std::make_unique<StateMachine,std::shared_ptr<Data>&,std::shared_ptr<Status>&>
            ((shared_ptr<Data> *)
             &resultingStatus.
              super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (shared_ptr<Status> *)
             &spExecStatus.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this = std::unique_ptr<StateMachine,_std::default_delete<StateMachine>_>::operator->
                   ((unique_ptr<StateMachine,_std::default_delete<StateMachine>_> *)
                    &resultingStatus.
                     super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  StateMachine::runSTM(this);
  std::__shared_ptr_access<Status,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Status,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_30);
  Status::getStatusMessage_abi_cxx11_((Status *)&__range1);
  this_00 = std::
            __shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ::get((__shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  message.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&message.field_2 + 8));
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_90,(string *)pbVar2);
    this_01 = std::operator<<((ostream *)&std::cout,local_90);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_90);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__range1);
  std::unique_ptr<StateMachine,_std::default_delete<StateMachine>_>::~unique_ptr
            ((unique_ptr<StateMachine,_std::default_delete<StateMachine>_> *)
             &resultingStatus.
              super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<Status>::~shared_ptr((shared_ptr<Status> *)local_30);
  std::shared_ptr<Data>::~shared_ptr
            ((shared_ptr<Data> *)
             &spExecStatus.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

int main()
{
    
    auto spData{ std::make_shared<Data>() };
    auto spExecStatus{ std::make_shared<Status>() };
    auto spSTM{ std::make_unique<StateMachine>(spData, spExecStatus) };

    spSTM->runSTM();
    
    auto resultingStatus = spExecStatus->getStatusMessage();
    for(auto message : *(resultingStatus.get()) )
    {
        std::cout << message << std::endl;
    }
    return 0;

}